

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O2

_Bool conf_deserialise(Conf *conf,BinarySource *src)

{
  _Bool _Var1;
  unsigned_long uVar2;
  conf_entry *entry;
  char *pcVar3;
  FontSpec *pFVar4;
  uint uVar5;
  
  do {
    uVar2 = BinarySource_get_uint32(src->binarysource_);
    if (src->binarysource_->err != BSE_NO_ERROR) {
      return false;
    }
    uVar5 = (uint)uVar2;
    if (uVar5 == 0xffffffff) {
      return true;
    }
    if (0xcd < uVar5) {
      return false;
    }
    entry = (conf_entry *)safemalloc(1,0x18,0);
    (entry->key).primary = uVar5;
    if (subkeytypes[uVar2 & 0xff] == 3) {
      pcVar3 = BinarySource_get_asciz(src->binarysource_);
      pcVar3 = dupstr(pcVar3);
      (entry->key).secondary.s = pcVar3;
    }
    else if (subkeytypes[uVar2 & 0xff] == 2) {
      uVar2 = BinarySource_get_uint32(src->binarysource_);
      (entry->key).secondary.i = (int)uVar2;
    }
    switch(valuetypes[(entry->key).primary]) {
    case 1:
      _Var1 = BinarySource_get_bool(src->binarysource_);
      (entry->value).u.boolval = _Var1;
      break;
    case 2:
      uVar2 = BinarySource_get_uint32(src->binarysource_);
      (entry->value).u.intval = (int)uVar2;
      break;
    case 3:
      pcVar3 = BinarySource_get_asciz(src->binarysource_);
      pFVar4 = (FontSpec *)dupstr(pcVar3);
      goto LAB_0015782a;
    case 4:
      pFVar4 = (FontSpec *)filename_deserialise(src);
      goto LAB_0015782a;
    case 5:
      pFVar4 = fontspec_deserialise(src);
LAB_0015782a:
      (entry->value).u.fontval = pFVar4;
    }
    if (src->binarysource_->err != BSE_NO_ERROR) {
      free_entry(entry);
      return false;
    }
    conf_insert(conf,entry);
  } while( true );
}

Assistant:

bool conf_deserialise(Conf *conf, BinarySource *src)
{
    struct conf_entry *entry;
    unsigned primary;

    while (1) {
        primary = get_uint32(src);

        if (get_err(src))
            return false;
        if (primary == 0xFFFFFFFFU)
            return true;
        if (primary >= N_CONFIG_OPTIONS)
            return false;

        entry = snew(struct conf_entry);
        entry->key.primary = primary;

        switch (subkeytypes[entry->key.primary]) {
          case TYPE_INT:
            entry->key.secondary.i = toint(get_uint32(src));
            break;
          case TYPE_STR:
            entry->key.secondary.s = dupstr(get_asciz(src));
            break;
        }

        switch (valuetypes[entry->key.primary]) {
          case TYPE_BOOL:
            entry->value.u.boolval = get_bool(src);
            break;
          case TYPE_INT:
            entry->value.u.intval = toint(get_uint32(src));
            break;
          case TYPE_STR:
            entry->value.u.stringval = dupstr(get_asciz(src));
            break;
          case TYPE_FILENAME:
            entry->value.u.fileval = filename_deserialise(src);
            break;
          case TYPE_FONT:
            entry->value.u.fontval = fontspec_deserialise(src);
            break;
        }

        if (get_err(src)) {
            free_entry(entry);
            return false;
        }

        conf_insert(conf, entry);
    }
}